

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O1

size_t __thiscall llama_context::state_read_data(llama_context *this,llama_io_read_i *io)

{
  uint uVar1;
  pointer piVar2;
  int32_t iVar3;
  int iVar4;
  int32_t iVar5;
  char *__s;
  undefined4 extraout_var;
  runtime_error *prVar6;
  uint uVar7;
  ulong uVar8;
  string arch_str;
  string cur_arch_str;
  int32_t n_outputs;
  string local_98;
  string local_70;
  string local_50;
  
  llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: reading state\n","state_read_data");
  llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: - reading model info\n","state_read_data");
  __s = llm_arch_name(this->model->arch);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,__s,(allocator<char> *)&local_98);
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity =
       local_98.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  llama_io_read_i::read_string(io,&local_98);
  if (local_70._M_string_length == local_98._M_string_length) {
    if (local_70._M_string_length != 0) {
      iVar4 = bcmp(local_70._M_dataplus._M_p,local_98._M_dataplus._M_p,local_70._M_string_length);
      if (iVar4 != 0) goto LAB_001909ac;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: - reading output ids\n","state_read_data");
    local_50._M_dataplus._M_p._0_4_ = this->n_outputs;
    (*io->_vptr_llama_io_read_i[3])(io,&local_50,4);
    iVar3 = (int32_t)local_50._M_dataplus._M_p;
    iVar5 = output_reserve(this,(int32_t)local_50._M_dataplus._M_p);
    if (iVar5 < iVar3) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar6,"could not reserve outputs");
    }
    else {
      local_98._M_dataplus._M_p = (pointer)0x0;
      local_98._M_string_length = 0;
      local_98.field_2._M_allocated_capacity = 0;
      if ((long)(int32_t)local_50._M_dataplus._M_p != 0) {
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)&local_98,
                   (long)(int32_t)local_50._M_dataplus._M_p);
        (*io->_vptr_llama_io_read_i[3])
                  (io,local_98._M_dataplus._M_p,(long)(int32_t)local_50._M_dataplus._M_p << 2);
        uVar7 = (uint)(local_98._M_string_length - (long)local_98._M_dataplus._M_p >> 2);
        if (0 < (int)uVar7) {
          piVar2 = (this->output_ids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar8 = 0;
          do {
            uVar1 = *(uint *)(local_98._M_dataplus._M_p + uVar8 * 4);
            if ((this->cparams).n_batch <= uVar1) {
              prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
              format_abi_cxx11_(&local_70,"invalid output id, %d does not fit in batch size of %u",
                                (ulong)uVar1,(ulong)(this->cparams).n_batch);
              std::runtime_error::runtime_error(prVar6,(string *)&local_70);
              __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            piVar2[(int)uVar1] = (int)uVar8;
            uVar8 = uVar8 + 1;
          } while ((uVar7 & 0x7fffffff) != uVar8);
        }
        this->n_outputs = (int32_t)local_50._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_98._M_dataplus._M_p,
                        local_98.field_2._M_allocated_capacity - (long)local_98._M_dataplus._M_p);
      }
      llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: - reading logits\n","state_read_data");
      (*io->_vptr_llama_io_read_i[3])(io,&local_70,8);
      if ((pointer)this->logits_size < local_70._M_dataplus._M_p) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar6,"logits buffer too small");
      }
      else {
        if (local_70._M_dataplus._M_p != (pointer)0x0) {
          (*io->_vptr_llama_io_read_i[3])(io,this->logits,(long)local_70._M_dataplus._M_p << 2);
        }
        llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: - reading embeddings\n","state_read_data");
        (*io->_vptr_llama_io_read_i[3])(io,&local_70,8);
        if (local_70._M_dataplus._M_p <= (pointer)this->embd_size) {
          if (local_70._M_dataplus._M_p != (pointer)0x0) {
            (*io->_vptr_llama_io_read_i[3])(io,this->embd,(long)local_70._M_dataplus._M_p << 2);
          }
          llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: - reading KV self\n","state_read_data");
          llama_kv_cache_unified::state_read
                    ((this->kv_self)._M_t.
                     super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
                     .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl,io,-1);
          iVar4 = (*io->_vptr_llama_io_read_i[4])(io);
          return CONCAT44(extraout_var,iVar4);
        }
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar6,"embeddings buffer too small");
      }
    }
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_001909ac:
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  format_abi_cxx11_(&local_50,"wrong model arch: \'%s\' instead of \'%s\'",local_98._M_dataplus._M_p
                    ,local_70._M_dataplus._M_p);
  std::runtime_error::runtime_error(prVar6,(string *)&local_50);
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

size_t llama_context::state_read_data(llama_io_read_i & io) {
    LLAMA_LOG_DEBUG("%s: reading state\n", __func__);

    // read model info
    {
        LLAMA_LOG_DEBUG("%s: - reading model info\n", __func__);

        const std::string cur_arch_str = llm_arch_name(model.arch);

        std::string arch_str;
        io.read_string(arch_str);
        if (cur_arch_str != arch_str) {
            throw std::runtime_error(format("wrong model arch: '%s' instead of '%s'", arch_str.c_str(), cur_arch_str.c_str()));
        }
        // TODO: add more info which needs to be identical but which is not verified otherwise
    }

    // read output ids
    {
        LLAMA_LOG_DEBUG("%s: - reading output ids\n", __func__);

        auto n_outputs = this->n_outputs;
        io.read_to(&n_outputs, sizeof(n_outputs));

        if (n_outputs > output_reserve(n_outputs)) {
            throw std::runtime_error("could not reserve outputs");
        }

        std::vector<int32_t> output_pos;

        if (n_outputs) {
            output_pos.resize(n_outputs);
            io.read_to(output_pos.data(), n_outputs * sizeof(int32_t));

            for (int32_t i = 0; i < (int32_t) output_pos.size(); ++i) {
                int32_t id = output_pos[i];
                if ((uint32_t) id >= n_batch()) {
                    throw std::runtime_error(format("invalid output id, %d does not fit in batch size of %u", id, n_batch()));
                }
                this->output_ids[id] = i;
            }

            this->n_outputs = n_outputs;
        }
    }

    // read logits
    {
        LLAMA_LOG_DEBUG("%s: - reading logits\n", __func__);

        uint64_t logits_size;
        io.read_to(&logits_size, sizeof(logits_size));

        if (this->logits_size < logits_size) {
            throw std::runtime_error("logits buffer too small");
        }

        if (logits_size) {
            io.read_to(this->logits, logits_size * sizeof(float));
        }
    }

    // read embeddings
    {
        LLAMA_LOG_DEBUG("%s: - reading embeddings\n", __func__);

        uint64_t embd_size;
        io.read_to(&embd_size, sizeof(embd_size));

        if (this->embd_size < embd_size) {
            throw std::runtime_error("embeddings buffer too small");
        }

        if (embd_size) {
            io.read_to(this->embd, embd_size * sizeof(float));
        }
    }

    LLAMA_LOG_DEBUG("%s: - reading KV self\n", __func__);
    kv_self->state_read(io);

    return io.n_bytes();
}